

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

bool __thiscall LTFlightData::TryDeriveGrndStatus(LTFlightData *this,positionTy *pos)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  dataRefsLT dVar4;
  double *pdVar5;
  positionTy *in_RSI;
  long in_RDI;
  double __value;
  system_error *e;
  double terrainAlt;
  unique_lock<std::recursive_mutex> lock;
  LTFlightData *in_stack_ffffffffffffff28;
  LTFlightData *in_stack_ffffffffffffff30;
  double local_b0;
  unique_lock<std::recursive_mutex> local_28;
  positionTy *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::unique_lock<std::recursive_mutex>::unique_lock(&local_28,in_RDI + 0x378);
  bVar2 = std::unique_lock::operator_cast_to_bool((unique_lock<std::recursive_mutex> *)0x1dcf07);
  if (bVar2) {
    __value = YProbe_at_m(in_stack_ffffffffffffff30,(positionTy *)in_stack_ffffffffffffff28);
    uVar3 = std::isnan(__value);
    if ((uVar3 & 1) == 0) {
      bVar2 = positionTy::IsOnGnd(local_18);
      if (!bVar2) {
        pdVar5 = positionTy::alt_m(local_18);
        dVar1 = *pdVar5;
        dVar4 = GetCurrChannel(in_stack_ffffffffffffff28);
        local_b0 = 20.0;
        if (dVar4 != DR_CHANNEL_REAL_TRAFFIC_ONLINE) {
          local_b0 = 10.0;
        }
        if (dVar1 < __value + local_b0) {
          local_18->f = (posFlagsTy)((ushort)local_18->f & 0xfcff | 0x200);
        }
      }
      bVar2 = positionTy::IsOnGnd(local_18);
      if (bVar2) {
        in_stack_ffffffffffffff30 = (LTFlightData *)(__value + -0.5);
        pdVar5 = positionTy::alt_m(local_18);
        *pdVar5 = (double)in_stack_ffffffffffffff30;
      }
      else {
        local_18->f = (posFlagsTy)((ushort)local_18->f & 0xfcff | 0x100);
      }
      local_1 = 1;
      bVar2 = true;
    }
    else {
      local_1 = 0;
      bVar2 = true;
    }
  }
  else {
    bVar2 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff30);
  if (!bVar2) {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool LTFlightData::TryDeriveGrndStatus (positionTy& pos)
{
    try {
        std::unique_lock<std::recursive_mutex> lock (dataAccessMutex, std::try_to_lock );
        if ( lock )
        {
            // what's the terrain altitude at that pos?
            double terrainAlt = YProbe_at_m(pos);
            if (std::isnan(terrainAlt))
                return false;
            
            // Now 2 options:
            // If position already says itself: I'm on the ground, then keep it like that
            // Otherwise decide based on altitude _if_ it's on the ground
            if (!pos.IsOnGnd() &&
                // say it's on the ground if below terrain+10m (or 20m in case of RealTraffic)
                pos.alt_m() < terrainAlt + (GetCurrChannel() == DR_CHANNEL_REAL_TRAFFIC_ONLINE ? FD_GND_AGL_EXT : FD_GND_AGL))
                pos.f.onGrnd = GND_ON;

            // if it was or now is on the ground correct the altitue to terrain altitude
            // (very slightly below to be sure to actually touch down even after rounding effects)
            if (pos.IsOnGnd())
                pos.alt_m() = terrainAlt - MDL_CLOSE_TO_GND;
            else
                // make sure it's either GND_ON or GND_OFF, nothing lese
                pos.f.onGrnd = GND_OFF;

            // successfully determined a status
            return true;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    
    // Either didn't get the lock or some caught error
    return false;
}